

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

void __thiscall
QUnicodeControlCharacterMenu::menuActionTriggered(QUnicodeControlCharacterMenu *this)

{
  int iVar1;
  qsizetype qVar2;
  QTextEdit *pQVar3;
  QWidgetTextControl *pQVar4;
  QLineEdit *pQVar5;
  QListSpecialMethodsBase<QAction_*> *in_RDI;
  long in_FS_OFFSET;
  QLineEdit *edit_1;
  QWidgetTextControl *control;
  QTextEdit *edit;
  int idx;
  QString str;
  QChar c;
  QAction *a;
  QString *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  QString local_48;
  QChar local_2a [13];
  QAction *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QObject::sender();
  local_10 = qobject_cast<QAction*>((QObject *)0x7213b8);
  QWidget::actions((QWidget *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  qVar2 = QListSpecialMethodsBase<QAction*>::indexOf<QAction*>
                    (in_RDI,(QAction **)in_stack_ffffffffffffff68,0x7213e5);
  iVar1 = (int)qVar2;
  QList<QAction_*>::~QList((QList<QAction_*> *)0x7213f3);
  if ((-1 < iVar1) && (iVar1 < 0xe)) {
    local_2a[0].ucs = L'ꪪ';
    QChar::QChar<unsigned_short,_true>(local_2a,qt_controlCharacters[iVar1].character);
    local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QString::QString(&local_48,(QChar *)(ulong)(ushort)local_2a[0].ucs);
    pQVar3 = qobject_cast<QTextEdit*>((QObject *)0x721486);
    if (pQVar3 == (QTextEdit *)0x0) {
      pQVar4 = qobject_cast<QWidgetTextControl*>((QObject *)0x7214ba);
      if (pQVar4 != (QWidgetTextControl *)0x0) {
        QWidgetTextControl::insertPlainText((QWidgetTextControl *)in_RDI,in_stack_ffffffffffffff68);
      }
      pQVar5 = qobject_cast<QLineEdit*>((QObject *)0x7214e4);
      if (pQVar5 != (QLineEdit *)0x0) {
        QLineEdit::insert((QLineEdit *)in_RDI,in_stack_ffffffffffffff68);
      }
    }
    else {
      QTextEdit::insertPlainText((QTextEdit *)in_RDI,in_stack_ffffffffffffff68);
    }
    QString::~QString((QString *)0x72151c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QUnicodeControlCharacterMenu::menuActionTriggered()
{
    QAction *a = qobject_cast<QAction *>(sender());
    int idx = actions().indexOf(a);
    if (idx < 0 || idx >= NUM_CONTROL_CHARACTERS)
        return;
    QChar c(qt_controlCharacters[idx].character);
    QString str(c);

#if QT_CONFIG(textedit)
    if (QTextEdit *edit = qobject_cast<QTextEdit *>(editWidget)) {
        edit->insertPlainText(str);
        return;
    }
#endif
    if (QWidgetTextControl *control = qobject_cast<QWidgetTextControl *>(editWidget)) {
        control->insertPlainText(str);
    }
#if QT_CONFIG(lineedit)
    if (QLineEdit *edit = qobject_cast<QLineEdit *>(editWidget)) {
        edit->insert(str);
        return;
    }
#endif
}